

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::StrictEqual(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  Type leftType;
  ScriptContext *in_R8;
  Type rightType;
  ulong uVar7;
  uint local_3c;
  Var pvStack_38;
  BOOL result;
  
  pvStack_38 = aLeft;
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ab4b7d;
    *puVar5 = 0;
  }
  uVar7 = (ulong)pvStack_38 & 0xffff000000000000;
  if (((ulong)pvStack_38 & 0x1ffff00000000) != 0x1000000000000 && uVar7 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab4b7d;
    *puVar5 = 0;
  }
  leftType = TypeIds_FirstNumberType;
  if ((uVar7 != 0x1000000000000) && (leftType = TypeIds_Number, (ulong)pvStack_38 >> 0x32 == 0)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvStack_38);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ab4b7d;
      *puVar5 = 0;
    }
    leftType = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)leftType) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00ab4b7d;
      *puVar5 = 0;
    }
  }
  if ((pvStack_38 == aRight) && (leftType != TypeIds_Number)) {
    return 1;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ab4b7d;
    *puVar5 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab4b7d;
    *puVar5 = 0;
  }
  rightType = TypeIds_FirstNumberType;
  if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
     (rightType = TypeIds_Number, (ulong)aRight >> 0x32 == 0)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ab4b7d;
      *puVar5 = 0;
    }
    rightType = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)rightType) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00ab4b7d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  if (leftType == TypeIds_String) {
    if (rightType != TypeIds_String) {
      return 0;
    }
    aLeft_00 = UnsafeVarTo<Js::JavascriptString>(pvStack_38);
    aRight_00 = UnsafeVarTo<Js::JavascriptString>(aRight);
    bVar2 = JavascriptString::Equals(aLeft_00,aRight_00);
  }
  else {
    if (leftType - TypeIds_FirstNumberType < 4) {
      BVar3 = StrictEqualNumberType(pvStack_38,aRight,leftType,rightType,in_R8);
      return BVar3;
    }
    if (leftType != TypeIds_BigInt) {
      if (leftType != TypeIds_GlobalObject) {
        return (uint)(pvStack_38 == aRight);
      }
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvStack_38);
      iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2f])(pRVar6,aRight,&local_3c,requestContext);
      if (iVar4 != 0) {
        return local_3c;
      }
      return 0;
    }
    if (rightType != TypeIds_BigInt) {
      return 0;
    }
    bVar2 = JavascriptBigInt::Equals(pvStack_38,aRight);
  }
  return (uint)bVar2;
}

Assistant:

BOOL JavascriptOperators::StrictEqual(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqual);
        TypeId rightType, leftType;
        leftType = JavascriptOperators::GetTypeId(aLeft);

        // Because NaN !== NaN, we may not return TRUE when typeId is Number
        if (aLeft == aRight && leftType != TypeIds_Number) return TRUE;

        rightType = JavascriptOperators::GetTypeId(aRight);

        if (leftType == TypeIds_String)
        {
            if (rightType == TypeIds_String)
            {
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            return FALSE;
        }
        else if (leftType >= TypeIds_Integer && leftType <= TypeIds_UInt64Number)
        {
            return JavascriptOperators::StrictEqualNumberType(aLeft, aRight, leftType, rightType, requestContext);
        }
        else if (leftType == TypeIds_GlobalObject)
        {
            BOOL result;
            if (UnsafeVarTo<RecyclableObject>(aLeft)->StrictEquals(aRight, &result, requestContext))
            {
                return result;
            }
            return false;
        }
        else if (leftType == TypeIds_BigInt)
        {
            if (rightType == TypeIds_BigInt)
            {
                return JavascriptBigInt::Equals(aLeft, aRight);
            }
            return FALSE;
        }

        return aLeft == aRight;
        JIT_HELPER_END(Op_StrictEqual);
    }